

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightLeSample * __thiscall
pbrt::DistantLight::SampleLe
          (LightLeSample *__return_storage_ptr__,DistantLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined8 uVar6;
  Float aFVar8 [4];
  float fVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [56];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar25 [56];
  undefined1 auVar24 [64];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar36 [16];
  float fVar40;
  SampledSpectrum SVar41;
  float local_58;
  float fStack_54;
  
  aFVar8 = (this->super_LightBase).renderFromLight.m.m[0];
  auVar28 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1);
  auVar19 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2);
  FVar1 = (this->super_LightBase).renderFromLight.m.m[1][0];
  FVar2 = (this->super_LightBase).renderFromLight.m.m[1][1];
  FVar3 = (this->super_LightBase).renderFromLight.m.m[1][2];
  FVar4 = (this->super_LightBase).renderFromLight.m.m[2][0];
  fVar27 = (this->super_LightBase).renderFromLight.m.m[2][1];
  fVar40 = (this->super_LightBase).renderFromLight.m.m[2][2];
  fVar13 = (u1->super_Tuple2<pbrt::Point2,_float>).x;
  fVar17 = (u1->super_Tuple2<pbrt::Point2,_float>).y;
  auVar14._0_4_ = fVar13 + fVar13;
  auVar14._4_4_ = fVar17 + fVar17;
  auVar14._8_8_ = 0;
  auVar33._8_4_ = 0xbf800000;
  auVar33._0_8_ = 0xbf800000bf800000;
  auVar33._12_4_ = 0xbf800000;
  auVar14 = vaddps_avx512vl(auVar14,auVar33);
  fVar17 = auVar14._0_4_;
  auVar33 = vmovshdup_avx(auVar14);
  fVar13 = auVar33._0_4_;
  if (fVar17 == 0.0) {
    auVar33 = ZEXT816(0) << 0x40;
    if ((fVar13 == 0.0) && (!NAN(fVar13))) goto LAB_003c095a;
  }
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx512vl(auVar14,auVar15);
  auVar16._0_4_ = fVar17 / fVar13;
  auVar16._4_12_ = auVar14._4_12_;
  auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar16,ZEXT416(0x3fc90fdb));
  auVar33 = vshufps_avx(auVar15,auVar15,0xf5);
  bVar10 = auVar33._0_4_ < auVar15._0_4_;
  fVar12 = (float)((uint)bVar10 * (int)((fVar13 / fVar17) * 0.7853982) +
                  (uint)!bVar10 * auVar14._0_4_);
  fVar13 = (float)((uint)bVar10 * (int)fVar17 + (uint)!bVar10 * (int)fVar13);
  fVar17 = cosf(fVar12);
  fVar12 = sinf(fVar12);
  auVar33 = vinsertps_avx(ZEXT416((uint)(fVar13 * fVar17)),ZEXT416((uint)(fVar13 * fVar12)),0x10);
LAB_003c095a:
  fVar13 = this->scale;
  auVar14 = vinsertps_avx((undefined1  [16])aFVar8,ZEXT416((uint)FVar1),0x10);
  auVar28 = vinsertps_avx(auVar28,ZEXT416((uint)FVar2),0x10);
  auVar18._0_4_ = auVar28._0_4_ * 0.0;
  auVar18._4_4_ = auVar28._4_4_ * 0.0;
  auVar18._8_4_ = auVar28._8_4_ * 0.0;
  auVar18._12_4_ = auVar28._12_4_ * 0.0;
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)FVar4),ZEXT816(0) << 0x40,ZEXT416((uint)(fVar27 * 0.0)));
  auVar14 = vfmadd213ps_fma(auVar14,ZEXT816(0) << 0x40,auVar18);
  auVar28 = vinsertps_avx(auVar19,ZEXT416((uint)FVar3),0x10);
  fVar40 = fVar40 + auVar15._0_4_;
  uVar5 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar7 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  auVar19._0_4_ = auVar28._0_4_ + auVar14._0_4_;
  auVar19._4_4_ = auVar28._4_4_ + auVar14._4_4_;
  auVar19._8_4_ = auVar28._8_4_ + auVar14._8_4_;
  auVar19._12_4_ = auVar28._12_4_ + auVar14._12_4_;
  auVar28._0_4_ = auVar19._0_4_ * auVar19._0_4_;
  auVar28._4_4_ = auVar19._4_4_ * auVar19._4_4_;
  auVar28._8_4_ = auVar19._8_4_ * auVar19._8_4_;
  auVar28._12_4_ = auVar19._12_4_ * auVar19._12_4_;
  auVar28 = vmovshdup_avx(auVar28);
  auVar28 = vfmadd231ss_fma(auVar28,auVar19,auVar19);
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
  auVar28 = vsqrtss_avx(auVar28,auVar28);
  fVar27 = auVar28._0_4_;
  fVar40 = fVar40 / fVar27;
  auVar31._4_4_ = fVar27;
  auVar31._0_4_ = fVar27;
  auVar31._8_4_ = fVar27;
  auVar31._12_4_ = fVar27;
  fVar27 = this->sceneRadius;
  auVar28 = vdivps_avx(auVar19,auVar31);
  auVar20._8_4_ = 0x3f800000;
  auVar20._0_8_ = 0x3f8000003f800000;
  auVar20._12_4_ = 0x3f800000;
  auVar32._8_4_ = 0x80000000;
  auVar32._0_8_ = 0x8000000080000000;
  auVar32._12_4_ = 0x80000000;
  auVar15 = vpternlogd_avx512vl(auVar20,ZEXT416((uint)fVar40),auVar32,0xf8);
  auVar25 = (undefined1  [56])0x0;
  fVar11 = auVar15._0_4_;
  fVar35 = auVar28._0_4_;
  fVar9 = auVar33._0_4_;
  auVar26._0_4_ = fVar35 * fVar9;
  fVar37 = auVar28._4_4_;
  auVar26._4_4_ = fVar37 * auVar33._4_4_;
  fVar38 = auVar28._8_4_;
  auVar26._8_4_ = fVar38 * auVar33._8_4_;
  fVar39 = auVar28._12_4_;
  auVar26._12_4_ = fVar39 * auVar33._12_4_;
  auVar14 = vmovshdup_avx(auVar26);
  fVar17 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  auVar22 = (undefined1  [56])0x0;
  SVar41 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar24._0_8_ = SVar41.values.values._8_8_;
  auVar24._8_56_ = auVar25;
  auVar21._0_8_ = SVar41.values.values._0_8_;
  auVar21._8_56_ = auVar22;
  auVar19 = vmovlhps_avx(auVar21._0_16_,auVar24._0_16_);
  auVar23._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
  auVar23._8_4_ = -fVar38;
  auVar23._12_4_ = -fVar39;
  auVar29._0_4_ = -1.0 / (fVar11 + fVar40);
  auVar28 = vmovshdup_avx(auVar28);
  fVar12 = fVar35 * auVar28._0_4_ * auVar29._0_4_;
  auVar29._4_4_ = auVar29._0_4_;
  auVar29._8_4_ = auVar29._0_4_;
  auVar29._12_4_ = auVar29._0_4_;
  auVar16 = vpermi2ps_avx512vl(_DAT_004ffb60,ZEXT416((uint)(fVar11 * fVar12)),ZEXT416((uint)fVar12))
  ;
  auVar28 = vshufps_avx(auVar33,auVar33,0xe1);
  auVar36._8_4_ = 0x3f800000;
  auVar36._0_8_ = 0x3f8000003f800000;
  auVar36._12_4_ = 0x3f800000;
  auVar34._0_4_ = fVar35 * fVar35 * fVar11;
  auVar34._4_4_ = fVar37 * 0.0;
  auVar34._8_4_ = fVar38 * 0.0;
  auVar34._12_4_ = fVar39 * 0.0;
  auVar15 = vunpcklps_avx(auVar36,auVar15);
  auVar15 = vfmadd231ps_fma(auVar15,auVar34,auVar29);
  auVar30._0_4_ =
       fVar35 * fVar27 +
       fVar27 * (fVar35 * 0.0 + auVar16._0_4_ * auVar28._0_4_ + fVar9 * auVar15._0_4_) +
       (float)uVar5;
  auVar30._4_4_ =
       fVar37 * fVar27 +
       fVar27 * (fVar37 * 0.0 + auVar16._4_4_ * auVar28._4_4_ + auVar33._4_4_ * auVar15._4_4_) +
       (float)uVar7;
  auVar30._8_4_ =
       fVar38 * fVar27 +
       fVar27 * (fVar38 * 0.0 + auVar16._8_4_ * auVar28._8_4_ + auVar33._8_4_ * auVar15._8_4_) + 0.0
  ;
  auVar30._12_4_ =
       fVar39 * fVar27 +
       fVar27 * (fVar39 * 0.0 + auVar16._12_4_ * auVar28._12_4_ + auVar33._12_4_ * auVar15._12_4_) +
       0.0;
  fVar12 = this->sceneRadius;
  (__return_storage_ptr__->L).values.values[0] = auVar19._0_4_ * fVar13;
  (__return_storage_ptr__->L).values.values[1] = auVar19._4_4_ * fVar13;
  (__return_storage_ptr__->L).values.values[2] = auVar19._8_4_ * fVar13;
  (__return_storage_ptr__->L).values.values[3] = auVar19._12_4_ * fVar13;
  uVar6 = vmovlps_avx(auVar30);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar6;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar6 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       fVar40 * fVar27 +
       fVar27 * (fVar40 * 0.0 + (fVar35 * -fVar11 * fVar9 - auVar14._0_4_)) + fVar17;
  uVar6 = vmovlps_avx(auVar23);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar6 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = -fVar40;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0 / (fVar12 * fVar12 * 3.1415927);
  __return_storage_ptr__->pdfDir = 1.0;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample DistantLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                     SampledWavelengths &lambda, Float time) const {
    // Choose point on disk oriented toward infinite light direction
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    Frame wFrame = Frame::FromZ(w);
    Point2f cd = SampleUniformDiskConcentric(u1);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));

    // Compute _DistantLight_ light ray
    Ray ray(pDisk + sceneRadius * w, -w, time);

    return LightLeSample(scale * Lemit.Sample(lambda), ray,
                         1 / (Pi * sceneRadius * sceneRadius), 1);
}